

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O0

double Distance::getGeodesicDistance(PhyloTree *t1,PhyloTree *t2,bool normalise)

{
  byte in_DL;
  double dVar1;
  double dVar2;
  invalid_argument *e;
  double distance;
  PhyloTree *in_stack_00000110;
  PhyloTree *in_stack_00000118;
  Geodesic *in_stack_ffffffffffffff50;
  PhyloTree *in_stack_ffffffffffffff90;
  Geodesic *in_stack_ffffffffffffffc0;
  double local_8;
  
  Geodesic::getGeodesic(in_stack_00000118,in_stack_00000110);
  local_8 = Geodesic::getDist(in_stack_ffffffffffffffc0);
  Geodesic::~Geodesic(in_stack_ffffffffffffff50);
  if ((in_DL & 1) != 0) {
    dVar1 = PhyloTree::getDistanceFromOrigin(in_stack_ffffffffffffff90);
    dVar2 = PhyloTree::getDistanceFromOrigin(in_stack_ffffffffffffff90);
    local_8 = local_8 / (dVar1 + dVar2);
  }
  return local_8;
}

Assistant:

double Distance::getGeodesicDistance(PhyloTree &t1, PhyloTree &t2, bool normalise) {
    try {
        double distance = Geodesic::getGeodesic(t1, t2).getDist();
        if (normalise) return distance / (t1.getDistanceFromOrigin() + t2.getDistanceFromOrigin());
        return distance;
    } catch (std::invalid_argument &e) {
        std::cout << "ERROR! " << e.what() << std::endl;
        return std::numeric_limits<double>::infinity();
    }
}